

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O0

void __thiscall TNT::i_refvec<interval_*>::~i_refvec(i_refvec<interval_*> *this)

{
  i_refvec<interval_*> *this_local;
  
  if ((this->ref_count_ != (int *)0x0) &&
     (*this->ref_count_ = *this->ref_count_ + -1, *this->ref_count_ == 0)) {
    destroy(this);
  }
  return;
}

Assistant:

i_refvec<T>::~i_refvec()
{
	if (ref_count_ != NULL)
	{
		(*ref_count_)--;

		if (*ref_count_ == 0)
		destroy();
	}
}